

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord3h> *value)

{
  bool bVar1;
  texcoord3h local_28;
  texcoord3h v;
  optional<tinyusdz::value::texcoord3h> *value_local;
  AsciiParser *this_local;
  
  _v = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::operator=(_v);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_28);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::texcoord3h>::operator=(_v,&local_28);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord3h> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord3h v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}